

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3_randomness(int N,void *pBuf)

{
  uchar uVar1;
  int iVar2;
  sqlite3_mutex *p;
  sqlite3_vfs *pVfs;
  char local_138 [8];
  char k [256];
  int i;
  sqlite3_mutex *mutex;
  uchar *zBuf;
  uchar t;
  void *pBuf_local;
  int N_local;
  
  iVar2 = sqlite3_initialize();
  if (iVar2 == 0) {
    p = sqlite3MutexAlloc(5);
    sqlite3_mutex_enter(p);
    if ((N < 1) || (pBuf == (void *)0x0)) {
      sqlite3Prng.isInit = '\0';
      sqlite3_mutex_leave(p);
    }
    else {
      mutex = (sqlite3_mutex *)pBuf;
      pBuf_local._4_4_ = N;
      if (sqlite3Prng.isInit == '\0') {
        sqlite3Prng.j = '\0';
        sqlite3Prng.i = '\0';
        pVfs = sqlite3_vfs_find((char *)0x0);
        sqlite3OsRandomness(pVfs,0x100,local_138);
        k[0xfc] = '\0';
        k[0xfd] = '\0';
        k[0xfe] = '\0';
        k[0xff] = '\0';
        for (; (int)k._252_4_ < 0x100; k._252_4_ = k._252_4_ + 1) {
          sqlite3Prng.s[(int)k._252_4_] = (uchar)k._252_4_;
        }
        k[0xfc] = '\0';
        k[0xfd] = '\0';
        k[0xfe] = '\0';
        k[0xff] = '\0';
        for (; (int)k._252_4_ < 0x100; k._252_4_ = k._252_4_ + 1) {
          sqlite3Prng.j = sqlite3Prng.j + sqlite3Prng.s[(int)k._252_4_] + local_138[(int)k._252_4_];
          uVar1 = sqlite3Prng.s[sqlite3Prng.j];
          sqlite3Prng.s[sqlite3Prng.j] = sqlite3Prng.s[(int)k._252_4_];
          sqlite3Prng.s[(int)k._252_4_] = uVar1;
        }
        sqlite3Prng.isInit = '\x01';
      }
      do {
        sqlite3Prng.i = sqlite3Prng.i + 1;
        uVar1 = sqlite3Prng.s[sqlite3Prng.i];
        sqlite3Prng.j = sqlite3Prng.j + uVar1;
        sqlite3Prng.s[sqlite3Prng.i] = sqlite3Prng.s[sqlite3Prng.j];
        sqlite3Prng.s[sqlite3Prng.j] = uVar1;
        (mutex->mutex).__size[0] = sqlite3Prng.s[(byte)(uVar1 + sqlite3Prng.s[sqlite3Prng.i])];
        pBuf_local._4_4_ = pBuf_local._4_4_ + -1;
        mutex = (sqlite3_mutex *)((long)&mutex->mutex + 1);
      } while (pBuf_local._4_4_ != 0);
      sqlite3_mutex_leave(p);
    }
  }
  return;
}

Assistant:

SQLITE_API void sqlite3_randomness(int N, void *pBuf){
  unsigned char t;
  unsigned char *zBuf = pBuf;

  /* The "wsdPrng" macro will resolve to the pseudo-random number generator
  ** state vector.  If writable static data is unsupported on the target,
  ** we have to locate the state vector at run-time.  In the more common
  ** case where writable static data is supported, wsdPrng can refer directly
  ** to the "sqlite3Prng" state vector declared above.
  */
#ifdef SQLITE_OMIT_WSD
  struct sqlite3PrngType *p = &GLOBAL(struct sqlite3PrngType, sqlite3Prng);
# define wsdPrng p[0]
#else
# define wsdPrng sqlite3Prng
#endif

#if SQLITE_THREADSAFE
  sqlite3_mutex *mutex;
#endif

#ifndef SQLITE_OMIT_AUTOINIT
  if( sqlite3_initialize() ) return;
#endif

#if SQLITE_THREADSAFE
  mutex = sqlite3MutexAlloc(SQLITE_MUTEX_STATIC_PRNG);
#endif

  sqlite3_mutex_enter(mutex);
  if( N<=0 || pBuf==0 ){
    wsdPrng.isInit = 0;
    sqlite3_mutex_leave(mutex);
    return;
  }

  /* Initialize the state of the random number generator once,
  ** the first time this routine is called.  The seed value does
  ** not need to contain a lot of randomness since we are not
  ** trying to do secure encryption or anything like that...
  **
  ** Nothing in this file or anywhere else in SQLite does any kind of
  ** encryption.  The RC4 algorithm is being used as a PRNG (pseudo-random
  ** number generator) not as an encryption device.
  */
  if( !wsdPrng.isInit ){
    int i;
    char k[256];
    wsdPrng.j = 0;
    wsdPrng.i = 0;
    sqlite3OsRandomness(sqlite3_vfs_find(0), 256, k);
    for(i=0; i<256; i++){
      wsdPrng.s[i] = (u8)i;
    }
    for(i=0; i<256; i++){
      wsdPrng.j += wsdPrng.s[i] + k[i];
      t = wsdPrng.s[wsdPrng.j];
      wsdPrng.s[wsdPrng.j] = wsdPrng.s[i];
      wsdPrng.s[i] = t;
    }
    wsdPrng.isInit = 1;
  }

  assert( N>0 );
  do{
    wsdPrng.i++;
    t = wsdPrng.s[wsdPrng.i];
    wsdPrng.j += t;
    wsdPrng.s[wsdPrng.i] = wsdPrng.s[wsdPrng.j];
    wsdPrng.s[wsdPrng.j] = t;
    t += wsdPrng.s[wsdPrng.i];
    *(zBuf++) = wsdPrng.s[t];
  }while( --N );
  sqlite3_mutex_leave(mutex);
}